

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_add_raw_input
              (wally_tx *tx,uchar *txhash,size_t txhash_len,uint32_t utxo_index,uint32_t sequence,
              uchar *script,size_t script_len,wally_tx_witness_stack *witness,uint32_t flags)

{
  uchar *script_local;
  uint32_t sequence_local;
  uint32_t utxo_index_local;
  size_t txhash_len_local;
  uchar *txhash_local;
  wally_tx *tx_local;
  
  if (tx == (wally_tx *)0x0) {
    tx_local._4_4_ = -2;
  }
  else {
    tx_local._4_4_ =
         tx_add_elements_raw_input_at
                   (tx,(uint32_t)tx->num_inputs,txhash,txhash_len,utxo_index,sequence,script,
                    script_len,witness,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,
                    (uchar *)0x0,0,(uchar *)0x0,0,(wally_tx_witness_stack *)0x0,flags,false);
  }
  return tx_local._4_4_;
}

Assistant:

int wally_tx_add_raw_input(struct wally_tx *tx,
                           const unsigned char *txhash, size_t txhash_len,
                           uint32_t utxo_index, uint32_t sequence,
                           const unsigned char *script, size_t script_len,
                           const struct wally_tx_witness_stack *witness,
                           uint32_t flags)
{
    if (!tx)
        return WALLY_EINVAL;
    return tx_add_elements_raw_input_at(tx, tx->num_inputs, txhash, txhash_len,
                                        utxo_index, sequence, script,
                                        script_len, witness,
                                        NULL, 0, NULL, 0, NULL, 0, NULL, 0,
                                        NULL, 0, NULL, 0, NULL, flags, false);
}